

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysc_range_free(lysf_ctx *ctx,lysc_range *range)

{
  lysc_ext_instance *plVar1;
  void *pvVar2;
  long lVar3;
  
  if (range->parts != (lysc_range_part *)0x0) {
    free(&range->parts[-1].field_1);
  }
  lydict_remove(ctx->ctx,range->eapptag);
  lydict_remove(ctx->ctx,range->emsg);
  lydict_remove(ctx->ctx,range->dsc);
  lydict_remove(ctx->ctx,range->ref);
  lVar3 = 0;
  pvVar2 = (void *)0x0;
  while( true ) {
    plVar1 = range->exts;
    if (plVar1 == (lysc_ext_instance *)0x0) {
      return;
    }
    if (plVar1[-1].compiled <= pvVar2) break;
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar1->def + lVar3));
    pvVar2 = (void *)((long)pvVar2 + 1);
    lVar3 = lVar3 + 0x48;
  }
  free(&plVar1[-1].compiled);
  return;
}

Assistant:

static void
lysc_range_free(struct lysf_ctx *ctx, struct lysc_range *range)
{
    LY_ARRAY_FREE(range->parts);
    lydict_remove(ctx->ctx, range->eapptag);
    lydict_remove(ctx->ctx, range->emsg);
    lydict_remove(ctx->ctx, range->dsc);
    lydict_remove(ctx->ctx, range->ref);
    FREE_ARRAY(ctx, range->exts, lysc_ext_instance_free);
}